

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_error(lua_State *L)

{
  int32_t level;
  int iVar1;
  
  level = lj_lib_optint(L,2,1);
  lua_settop(L,1);
  iVar1 = lua_isstring(L,1);
  if (0 < level && iVar1 != 0) {
    luaL_where(L,level);
    lua_pushvalue(L,1);
    lua_concat(L,2);
  }
  iVar1 = lua_error(L);
  return iVar1;
}

Assistant:

LJLIB_CF(error)
{
  int32_t level = lj_lib_optint(L, 2, 1);
  lua_settop(L, 1);
  if (lua_isstring(L, 1) && level > 0) {
    luaL_where(L, level);
    lua_pushvalue(L, 1);
    lua_concat(L, 2);
  }
  return lua_error(L);
}